

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O0

int endswith(char *str,char *postfix)

{
  size_t sVar1;
  char *local_30;
  char *q;
  char *p;
  char *postfix_local;
  char *str_local;
  
  sVar1 = strlen(str);
  q = str + sVar1;
  sVar1 = strlen(postfix);
  local_30 = postfix + sVar1;
  do {
    q = q + -1;
    local_30 = local_30 + -1;
    if (q < str || local_30 < postfix) {
      return 1;
    }
  } while (*q == *local_30);
  return 0;
}

Assistant:

static int
endswith(const char * str, const char * postfix)
{
    const char * p = str + strlen(str) - 1;
    const char * q = postfix + strlen(postfix) - 1;
    for(; p >= str && q >= postfix; p --, q--) {
        if(*p != *q) return 0;
    }
    return 1;
}